

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int nifti_extension_size(nifti_image *nim)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  uVar2 = 0;
  if ((nim != (nifti_image *)0x0) && (uVar2 = 0, 0 < nim->num_ext)) {
    if (2 < g_opts_0) {
      fwrite("-d ext sizes:",0xd,1,_stderr);
    }
    lVar4 = 0;
    uVar2 = 0;
    for (lVar3 = 0; lVar3 < nim->num_ext; lVar3 = lVar3 + 1) {
      uVar1 = *(uint *)((long)&nim->ext_list->esize + lVar4);
      if (2 < g_opts_0) {
        fprintf(_stderr,"  %d",(ulong)uVar1);
      }
      uVar2 = uVar2 + uVar1;
      lVar4 = lVar4 + 0x10;
    }
    if (2 < g_opts_0) {
      fprintf(_stderr," (total = %d)\n",(ulong)uVar2);
    }
  }
  return uVar2;
}

Assistant:

int nifti_extension_size(nifti_image *nim)
{
   int c, size = 0;

   if( !nim || nim->num_ext <= 0 ) return 0;

   if( g_opts.debug > 2 ) fprintf(stderr,"-d ext sizes:");

   for ( c = 0; c < nim->num_ext; c++ ){
      size += nim->ext_list[c].esize;
      if( g_opts.debug > 2 ) fprintf(stderr,"  %d",nim->ext_list[c].esize);
   }

   if( g_opts.debug > 2 ) fprintf(stderr," (total = %d)\n",size);

   return size;
}